

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::TabulationRecord::
TabulationRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (TabulationRecord *this,InterpolationBase *interpolation,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_0000008c;
  int in_stack_ffffffffffffffb8;
  
  readPairs<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&stack0xffffffffffffffb8,
             (TabulationRecord *)
             (interpolation->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1],(long)it,end,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_0000008c,MAT),MF,MT,
             in_stack_ffffffffffffffb8);
  TabulationRecord(this,interpolation,
                   (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                    *)&stack0xffffffffffffffb8);
  std::
  _Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

TabulationRecord
( InterpolationBase&& interpolation,
  Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT  ) :
  TabulationRecord( std::move( interpolation ),
                    readPairs( interpolation.N2(), it, end,
                               lineNumber, MAT, MF, MT ) ) {}